

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

bool __thiscall GGSock::Communicator::stopListening(Communicator *this)

{
  Data *pDVar1;
  bool bVar2;
  lock_guard<std::mutex> lock;
  Data *data;
  mutex_type *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  pDVar1 = getData((Communicator *)0x12d413);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
             ,in_stack_ffffffffffffffc8);
  bVar2 = (pDVar1->isListening & 1U) != 0;
  if (bVar2) {
    pDVar1->isListening = false;
    anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x12d450);
    anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x12d460);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12d4a2);
  return bVar2;
}

Assistant:

bool Communicator::stopListening() {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutex);

        if (data.isListening) {
            data.isListening = false;

            ::closeAndReset(data.sdpeer);
            ::closeAndReset(data.sd);

            return true;
        }

        return false;
    }